

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::EventLoop::EventLoop(EventLoop *this)

{
  Event **ppEVar1;
  TaskSet *pTVar2;
  
  (this->port).ptr = (EventPort *)0x0;
  this->running = false;
  this->lastRunnableState = false;
  ppEVar1 = &this->head;
  this->head = (Event *)0x0;
  this->tail = ppEVar1;
  this->depthFirstInsertPoint = ppEVar1;
  this->breadthFirstInsertPoint = ppEVar1;
  this->wouldSleepHead = (Event *)0x0;
  this->wouldSleepTail = &this->wouldSleepHead;
  (this->executor).ptr.disposer = (Disposer *)0x0;
  (this->executor).ptr.ptr = (Executor *)0x0;
  (this->localMap).ptr.disposer = (Disposer *)0x0;
  (this->localMap).ptr.ptr = (LocalMap *)0x0;
  pTVar2 = (TaskSet *)operator_new(0x38);
  pTVar2->errorHandler = (ErrorHandler *)&kj::_::LoggingErrorHandler::instance;
  (pTVar2->tasks).ptr.ptr = (Task *)0x0;
  (pTVar2->emptyFulfiller).ptr.disposer = (Disposer *)0x0;
  (pTVar2->emptyFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (pTVar2->location).fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory.h"
  ;
  (pTVar2->location).function = "heap";
  (pTVar2->location).lineNumber = 0x293;
  (pTVar2->location).columnNumber = 0x15;
  (this->daemons).disposer = (Disposer *)&kj::_::HeapDisposer<kj::TaskSet>::instance;
  (this->daemons).ptr = pTVar2;
  this->currentlyFiring = (Event *)0x0;
  return;
}

Assistant:

EventLoop::EventLoop()
    : daemons(kj::heap<TaskSet>(_::LoggingErrorHandler::instance)) {}